

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O0

_Bool buffer_grow_fragments(buffer_t *buffer,zip_uint64_t capacity,zip_error_t *error)

{
  _Bool _Var1;
  zip_uint64_t local_38;
  zip_uint64_t offset_capacity;
  zip_uint64_t additional_fragments;
  zip_error_t *error_local;
  zip_uint64_t capacity_local;
  buffer_t *buffer_local;
  
  local_38 = buffer->fragments_capacity + 1;
  if (buffer->fragments_capacity < capacity) {
    offset_capacity = capacity - buffer->fragments_capacity;
    additional_fragments = (zip_uint64_t)error;
    error_local = (zip_error_t *)capacity;
    capacity_local = (zip_uint64_t)buffer;
    _Var1 = zip_realloc(&buffer->fragments,&buffer->fragments_capacity,0x10,offset_capacity,error);
    if (_Var1) {
      _Var1 = zip_realloc((void **)(capacity_local + 8),&local_38,8,offset_capacity,
                          (zip_error_t *)additional_fragments);
      if (_Var1) {
        buffer_local._7_1_ = true;
      }
      else {
        *(zip_uint64_t *)(capacity_local + 0x18) =
             *(long *)(capacity_local + 0x18) - offset_capacity;
        buffer_local._7_1_ = false;
      }
    }
    else {
      buffer_local._7_1_ = false;
    }
  }
  else {
    buffer_local._7_1_ = true;
  }
  return buffer_local._7_1_;
}

Assistant:

static bool
buffer_grow_fragments(buffer_t *buffer, zip_uint64_t capacity, zip_error_t *error) {
    zip_uint64_t additional_fragments;
    zip_uint64_t offset_capacity = buffer->fragments_capacity + 1;

    if (capacity <= buffer->fragments_capacity) {
        return true;
    }

    additional_fragments = capacity - buffer->fragments_capacity;

    if (!ZIP_REALLOC(buffer->fragments, buffer->fragments_capacity, additional_fragments, error)) {
        return false;
    }
    /* The size of both buffer->fragments and buffer->fragment_offsets is stored in buffer->fragments_capacity, so use a temporary capacity variable here for reallocating buffer->fragment_offsets. */
    if (!ZIP_REALLOC(buffer->fragment_offsets, offset_capacity, additional_fragments, error)) {
        buffer->fragments_capacity -= additional_fragments;
        return false;
    }

    return true;
}